

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv2d-dw.cpp
# Opt level: O0

bool check_equal(vector<float,_std::allocator<float>_> *result,
                vector<float,_std::allocator<float>_> *expected)

{
  float fVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  vector<float,_std::allocator<float>_> *pvVar5;
  float extraout_XMM0_Da;
  int i;
  uint local_1c;
  bool local_1;
  
  sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
  sVar3 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
  if (sVar2 == sVar3) {
    for (local_1c = 0; sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RDI),
        (ulong)(long)(int)local_1c < sVar2; local_1c = local_1c + 1) {
      std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(long)(int)local_1c);
      pvVar5 = in_RSI;
      std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)(int)local_1c);
      std::abs((int)pvVar5);
      if (1e-05 < extraout_XMM0_Da) {
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(long)(int)local_1c);
        fVar1 = *pvVar4;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)(int)local_1c);
        printf("result[%d] %f != %f expected[%d]\n",(double)fVar1,(double)*pvVar4,(ulong)local_1c,
               (ulong)local_1c);
        return false;
      }
    }
    local_1 = true;
  }
  else {
    sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
    sVar3 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
    printf("result.size() = %d, expected.size() = %d\n",sVar2 & 0xffffffff,sVar3 & 0xffffffff);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool check_equal(const std::vector<float> & result, const std::vector<float> & expected) {
    if (result.size() != expected.size()) {
        printf("result.size() = %d, expected.size() = %d\n", (int)result.size(), (int)expected.size());
        return false;
    }
    for (int i = 0; i < result.size(); i++) {
        if(std::abs(result[i] - expected[i]) > 1e-5) {
            printf("result[%d] %f != %f expected[%d]\n", i, result[i], expected[i], i);
            return false;
        }
    }
    return true;
}